

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O2

flatcc_builder_union_vec_ref_t
flatcc_builder_create_union_vector
          (flatcc_builder_t *B,flatcc_builder_union_ref_t *urefs,size_t count)

{
  int iVar1;
  flatcc_builder_ref_t *pfVar2;
  flatcc_builder_utype_t *types;
  flatcc_builder_union_vec_ref_t fVar3;
  size_t sVar4;
  
  iVar1 = flatcc_builder_start_offset_vector(B);
  if (((iVar1 == 0) &&
      (pfVar2 = flatcc_builder_extend_offset_vector(B,count), pfVar2 != (flatcc_builder_ref_t *)0x0)
      ) && (types = (flatcc_builder_utype_t *)push_ds(B,(flatbuffers_uoffset_t)count),
           types != (flatcc_builder_utype_t *)0x0)) {
    pfVar2 = (flatcc_builder_ref_t *)B->ds;
    for (sVar4 = 0; count != sVar4; sVar4 = sVar4 + 1) {
      types[sVar4] = urefs[sVar4].type;
      pfVar2[sVar4] = urefs[sVar4].value;
    }
    fVar3 = flatcc_builder_create_union_vector_direct(B,types,pfVar2,count);
    exit_frame(B);
    return fVar3;
  }
  fVar3.type = 0;
  fVar3.value = 0;
  return fVar3;
}

Assistant:

flatcc_builder_union_vec_ref_t flatcc_builder_create_union_vector(flatcc_builder_t *B,
        const flatcc_builder_union_ref_t *urefs, size_t count)
{
    flatcc_builder_union_vec_ref_t uvref = { 0, 0 };
    flatcc_builder_utype_t *types;
    flatcc_builder_ref_t *refs;
    size_t i;

    if (flatcc_builder_start_offset_vector(B)) {
        return uvref;
    }
    if (0 == flatcc_builder_extend_offset_vector(B, count)) {
        return uvref;
    }
    if (0 == (types = push_ds(B, (uoffset_t)(utype_size * count)))) {
        return uvref;
    }

    /* Safe even if push_ds caused stack reallocation. */
    refs = flatcc_builder_offset_vector_edit(B);

    for (i = 0; i < count; ++i) {
        types[i] = urefs[i].type;
        refs[i] = urefs[i].value;
    }
    uvref = flatcc_builder_create_union_vector_direct(B,
            types, refs, count);
    /* No need to clean up after out temporary types vector. */
    exit_frame(B);
    return uvref;
}